

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool __thiscall S2BooleanOperation::Impl::IsFullPolygonResult(Impl *this,Graph *g,S2Error *error)

{
  OpType OVar1;
  ostream *poVar2;
  double dVar3;
  S2LogMessage local_80;
  S2ShapeIndex *local_70;
  S2ShapeIndex *b;
  S2ShapeIndex *a;
  byte local_49;
  S2LogMessage local_48;
  S2LogMessageVoidify local_31;
  S1Angle local_30;
  S2Error *local_28;
  S2Error *error_local;
  Graph *g_local;
  Impl *this_local;
  
  local_28 = error;
  error_local = (S2Error *)g;
  g_local = (Graph *)this;
  local_30 = S2Builder::SnapFunction::kMaxSnapRadius();
  dVar3 = S1Angle::degrees(&local_30);
  local_49 = 0;
  if (70.0 < dVar3) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
               ,0x7f4,kFatal,(ostream *)&std::cerr);
    local_49 = 1;
    poVar2 = S2LogMessage::stream(&local_48);
    poVar2 = std::operator<<(poVar2,
                             "Check failed: (S2Builder::SnapFunction::kMaxSnapRadius().degrees()) <= (70) "
                            );
    S2LogMessageVoidify::operator&(&local_31,poVar2);
  }
  if ((local_49 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_48);
  }
  b = this->op_->regions_[0];
  local_70 = this->op_->regions_[1];
  OVar1 = op_type(this->op_);
  switch(OVar1) {
  case UNION:
    this_local._7_1_ = IsFullPolygonUnion(this,b,local_70);
    break;
  case INTERSECTION:
    this_local._7_1_ = IsFullPolygonIntersection(this,b,local_70);
    break;
  case DIFFERENCE:
    this_local._7_1_ = IsFullPolygonDifference(this,b,local_70);
    break;
  case SYMMETRIC_DIFFERENCE:
    this_local._7_1_ = IsFullPolygonSymmetricDifference(this,b,local_70);
    break;
  default:
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
               ,0x811,kFatal,(ostream *)&std::cerr);
    poVar2 = S2LogMessage::stream(&local_80);
    std::operator<<(poVar2,"Invalid S2BooleanOperation::OpType");
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_80);
  }
  return this_local._7_1_;
}

Assistant:

bool S2BooleanOperation::Impl::IsFullPolygonResult(
    const S2Builder::Graph& g, S2Error* error) const {
  // If there are no edges of dimension 2, the result could be either the
  // empty polygon or the full polygon.  Note that this is harder to determine
  // than you might think due to snapping.  For example, the union of two
  // non-empty polygons can be empty, because both polygons consist of tiny
  // loops that are eliminated by snapping.  Similarly, even if two polygons
  // both contain a common point their intersection can still be empty.
  //
  // We distinguish empty from full results using two heuristics:
  //
  //  1. We compute a bit mask representing the subset of the six S2 cube faces
  //     intersected by each input geometry, and use this to determine if only
  //     one of the two results is possible.  (This test is very fast.)  Note
  //     that snapping will never cause the result to cover an entire extra
  //     cube face because the maximum allowed snap radius is too small.
  S2_DCHECK_LE(S2Builder::SnapFunction::kMaxSnapRadius().degrees(), 70);
  //
  //  2. We compute the area of each input geometry, and use this to bound the
  //     minimum and maximum area of the result.  If only one of {0, 4*Pi} is
  //     possible then we are done.  If neither is possible then we choose the
  //     one that is closest to being possible (since snapping can change the
  //     result area).  Both results are possible only when computing the
  //     symmetric difference of two regions of area 2*Pi each, in which case we
  //     must resort to additional heuristics (see below).
  //
  // TODO(ericv): Implement a predicate that uses the results of edge snapping
  // directly, rather than computing areas.  This would not only be much faster
  // but would also allows all cases to be handled 100% robustly.
  const S2ShapeIndex& a = *op_->regions_[0];
  const S2ShapeIndex& b = *op_->regions_[1];
  switch (op_->op_type()) {
    case OpType::UNION:
      return IsFullPolygonUnion(a, b);

    case OpType::INTERSECTION:
      return IsFullPolygonIntersection(a, b);

    case OpType::DIFFERENCE:
      return IsFullPolygonDifference(a, b);

    case OpType::SYMMETRIC_DIFFERENCE:
      return IsFullPolygonSymmetricDifference(a, b);

    default:
      S2_LOG(FATAL) << "Invalid S2BooleanOperation::OpType";
      return false;
  }
}